

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

PathTypeHandlerNoAttr *
Js::PathTypeHandlerNoAttr::New
          (ScriptContext *scriptContext,PathTypeHandlerNoAttr *typeHandler,bool isLocked,
          bool isShared)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  PathTypeHandlerNoAttr *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (typeHandler == (PathTypeHandlerNoAttr *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xdd7,"(typeHandler != nullptr)","typeHandler != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d226db;
  data.filename._0_4_ = 0xdd8;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (PathTypeHandlerNoAttr *)new<Memory::Recycler>(0x38,alloc,0x387914);
  PathTypeHandlerNoAttr
            (this,(typeHandler->super_PathTypeHandlerBase).typePath.ptr,
             (typeHandler->super_PathTypeHandlerBase).super_DynamicTypeHandler.unusedBytes >> 1,
             (PropertyIndex)
             (typeHandler->super_PathTypeHandlerBase).super_DynamicTypeHandler.slotCapacity,
             (typeHandler->super_PathTypeHandlerBase).super_DynamicTypeHandler.inlineSlotCapacity,
             (typeHandler->super_PathTypeHandlerBase).super_DynamicTypeHandler.offsetOfInlineSlots,
             isLocked,isShared,(DynamicType *)0x0);
  return this;
}

Assistant:

PathTypeHandlerNoAttr * PathTypeHandlerNoAttr::New(ScriptContext * scriptContext, PathTypeHandlerNoAttr * typeHandler, bool isLocked, bool isShared)
    {
        Assert(typeHandler != nullptr);
        return RecyclerNew(scriptContext->GetRecycler(), PathTypeHandlerNoAttr, typeHandler->GetTypePath(), typeHandler->GetPathLength(), static_cast<PropertyIndex>(typeHandler->GetSlotCapacity()), typeHandler->GetInlineSlotCapacity(), typeHandler->GetOffsetOfInlineSlots(), isLocked, isShared);
    }